

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<unsigned_long>
          (TypedConfigurations *this,Level level,unsigned_long *value,
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,bool includeGlobalLevel)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type_conflict1 *pmVar3;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *in_RCX;
  unsigned_long *in_RDX;
  byte in_R8B;
  pair<el::Level,_unsigned_long> pVar4;
  iterator it;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *in_stack_ffffffffffffff48;
  unsigned_long uVar5;
  Level *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar6;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *in_stack_ffffffffffffff60;
  key_type *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  _Self local_78;
  _Base_ptr local_70;
  _Self local_68;
  undefined4 local_5c;
  _Self local_58 [3];
  undefined4 local_3c;
  Level local_38;
  unsigned_long local_30;
  byte local_21;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *local_20;
  unsigned_long *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = utils::std::
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          ::empty((map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                   *)0x2796ff);
  if ((bVar1) && ((local_21 & 1) != 0)) {
    local_3c = 1;
    pVar4 = std::make_pair<el::Level,unsigned_long_const&>
                      (in_stack_ffffffffffffff50,(unsigned_long *)in_stack_ffffffffffffff48);
    local_30 = pVar4.second;
    local_38 = pVar4.first;
    std::
    map<el::Level,unsigned_long,std::less<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
    ::insert<std::pair<el::Level,unsigned_long>>
              (local_20,(pair<el::Level,_unsigned_long> *)
                        CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  else {
    local_5c = 1;
    local_58[0]._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
         ::find(in_stack_ffffffffffffff48,(key_type *)0x27977f);
    local_68._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar1 = utils::std::operator!=(local_58,&local_68);
    uVar6 = false;
    if (bVar1) {
      ppVar2 = utils::std::_Rb_tree_iterator<std::pair<const_el::Level,_unsigned_long>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_el::Level,_unsigned_long>_> *)0x2797be)
      ;
      uVar6 = ppVar2->second == *local_18;
    }
    if ((bool)uVar6 == false) {
      local_70 = (_Base_ptr)
                 utils::std::
                 map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                 ::find(in_stack_ffffffffffffff48,(key_type *)0x2797f8);
      local_58[0]._M_node = local_70;
      local_78._M_node =
           (_Base_ptr)
           utils::std::
           map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
           ::end(in_stack_ffffffffffffff48);
      bVar1 = utils::std::operator==(local_58,&local_78);
      if (bVar1) {
        std::make_pair<el::Level&,unsigned_long_const&>
                  ((Level *)local_20,(unsigned_long *)in_stack_ffffffffffffff48);
        std::
        map<el::Level,unsigned_long,std::less<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
        ::insert<std::pair<el::Level,unsigned_long>>
                  (in_stack_ffffffffffffff60,
                   (pair<el::Level,_unsigned_long> *)CONCAT17(uVar6,in_stack_ffffffffffffff58));
      }
      else {
        uVar5 = *local_18;
        pmVar3 = utils::std::
                 map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                 ::at((map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                       *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
        *pmVar3 = uVar5;
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }